

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

FT_Error tt_size_init(FT_Size ttsize)

{
  FT_Error error;
  TT_Size size;
  FT_Size ttsize_local;
  
  *(undefined4 *)&ttsize[6].generic.data = 0xffffffff;
  *(undefined4 *)((long)&ttsize[6].generic.data + 4) = 0xffffffff;
  *(undefined1 *)&ttsize[2].metrics.ascender = 0;
  ttsize[2].metrics.descender = 0xffffffff;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_init( FT_Size  ttsize )           /* TT_Size */
  {
    TT_Size   size  = (TT_Size)ttsize;
    FT_Error  error = FT_Err_Ok;


#ifdef TT_USE_BYTECODE_INTERPRETER
    size->bytecode_ready = -1;
    size->cvt_ready      = -1;
#endif

    size->ttmetrics.valid = FALSE;
    size->strike_index    = 0xFFFFFFFFUL;

    return error;
  }